

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O0

void Scl_LibHandleInputDriver(SC_Cell *pCell,SC_Pair *pLoadIn,SC_Pair *pArrOut,SC_Pair *pSlewOut)

{
  SC_Timing *pSVar1;
  SC_Pair local_58;
  SC_Pair SlewOut;
  SC_Pair ArrOut1;
  SC_Pair ArrOut0;
  SC_Pair SlewIn;
  SC_Pair ArrIn;
  SC_Pair LoadIn;
  SC_Pair *pSlewOut_local;
  SC_Pair *pArrOut_local;
  SC_Pair *pLoadIn_local;
  SC_Cell *pCell_local;
  
  memset(&ArrIn,0,8);
  memset(&SlewIn,0,8);
  memset(&ArrOut0,0,8);
  memset(&ArrOut1,0,8);
  memset(&SlewOut,0,8);
  memset(&local_58,0,8);
  pSlewOut->rise = 0.0;
  pSlewOut->fall = 0.0;
  if (pCell->n_inputs == 1) {
    pSVar1 = Scl_CellPinTime(pCell,0);
    Scl_LibPinArrival(pSVar1,&SlewIn,&ArrOut0,&ArrIn,&ArrOut1,&local_58);
    pSVar1 = Scl_CellPinTime(pCell,0);
    Scl_LibPinArrival(pSVar1,&SlewIn,&ArrOut0,pLoadIn,&SlewOut,pSlewOut);
    pArrOut->fall = SlewOut.fall - ArrOut1.fall;
    pArrOut->rise = SlewOut.rise - ArrOut1.rise;
    return;
  }
  __assert_fail("pCell->n_inputs == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLib.h"
                ,0x2af,"void Scl_LibHandleInputDriver(SC_Cell *, SC_Pair *, SC_Pair *, SC_Pair *)");
}

Assistant:

static inline void Scl_LibHandleInputDriver( SC_Cell * pCell, SC_Pair * pLoadIn, SC_Pair * pArrOut, SC_Pair * pSlewOut )
{
    SC_Pair LoadIn   = { 0.0, 0.0 }; // zero input load
    SC_Pair ArrIn    = { 0.0, 0.0 }; // zero input time
    SC_Pair SlewIn   = { 0.0, 0.0 }; // zero input slew
    SC_Pair ArrOut0  = { 0.0, 0.0 }; // output time under zero load
    SC_Pair ArrOut1  = { 0.0, 0.0 }; // output time under given load
    SC_Pair SlewOut  = { 0.0, 0.0 }; // output slew under zero load 
    pSlewOut->fall = pSlewOut->rise = 0;
    assert( pCell->n_inputs == 1 );
    Scl_LibPinArrival( Scl_CellPinTime(pCell, 0), &ArrIn, &SlewIn, &LoadIn, &ArrOut0, &SlewOut );
    Scl_LibPinArrival( Scl_CellPinTime(pCell, 0), &ArrIn, &SlewIn, pLoadIn, &ArrOut1, pSlewOut );
    pArrOut->fall = ArrOut1.fall - ArrOut0.fall;
    pArrOut->rise = ArrOut1.rise - ArrOut0.rise;
}